

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

bool QMetaObjectPrivate::disconnect
               (QObject *sender,int signal_index,QMetaObject *smeta,QObject *receiver,
               int method_index,void **slot,DisconnectType disconnectType)

{
  totally_ordered_wrapper<QObjectPrivate::ConnectionData_*> connections;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  char *pcVar5;
  char *pcVar6;
  __sighandler_t p_Var7;
  undefined8 extraout_RDX;
  QBasicMutex *mutex;
  int sig_index;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<char> local_a0;
  QArrayDataPointer<char16_t> local_88;
  QMessageLogger local_70;
  QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData> local_50;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (sender == (QObject *)0x0) {
    bVar1 = false;
    goto LAB_0028d02a;
  }
  bVar1 = false;
  mutex = (QBasicMutex *)
          ((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p +
          (ulong)((uint)(((ulong)sender & 0xffffffff) % 0x418) & 0x7f8));
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QMutexLocker<QBasicMutex>::QMutexLocker((QMutexLocker<QBasicMutex> *)local_48,mutex);
  connections.ptr = (ConnectionData *)(sender->d_ptr).d[1].parent;
  if (connections.ptr != (ConnectionData *)0x0) {
    LOCK();
    ((connections.ptr)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         ((connections.ptr)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_50.d.ptr =
         (totally_ordered_wrapper<QObjectPrivate::ConnectionData_*>)
         (totally_ordered_wrapper<QObjectPrivate::ConnectionData_*>)connections.ptr;
    if (signal_index < 0) {
      if ((method_index < 0 && receiver == (QObject *)0x0) &&
         (bVar1 = QObjectPrivate::isSignalConnected((QObjectPrivate *)(sender->d_ptr).d,0,true),
         bVar1)) {
        local_70.context.version = 2;
        local_70.context.function._4_4_ = 0;
        local_70.context.line = 0;
        local_70.context.file._0_4_ = 0;
        local_70.context.file._4_4_ = 0;
        local_70.context.function._0_4_ = 0;
        local_70.context.category = "default";
        iVar3 = (**sender->_vptr_QObject)(sender);
        pcVar5 = QMetaObject::className((QMetaObject *)CONCAT44(extraout_var,iVar3));
        QObject::objectName((QString *)&local_88,sender);
        if (local_88.size == 0) {
          pcVar6 = "unnamed";
        }
        else {
          QObject::objectName((QString *)&local_b8,sender);
          QString::toLocal8Bit((QByteArray *)&local_a0,(QString *)&local_b8);
          pcVar6 = QByteArray::data((QByteArray *)&local_a0);
        }
        QMessageLogger::warning
                  (&local_70,
                   "QObject::disconnect: wildcard call disconnects from destroyed signal of %s::%s",
                   pcVar5,pcVar6);
        if (local_88.size != 0) {
          QArrayDataPointer<char>::~QArrayDataPointer(&local_a0);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
      }
      bVar1 = false;
      iVar3 = -1;
      while( true ) {
        iVar4 = -1;
        if (((connections.ptr)->signalVector).
            super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value._M_b._M_p !=
            (__pointer_type)0x0) {
          iVar4 = (int)(((connections.ptr)->signalVector).
                        super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value._M_b._M_p)
                       ->allocated;
        }
        if (iVar4 <= iVar3) break;
        bVar2 = disconnectHelper((ConnectionData *)local_50.d.ptr,iVar3,receiver,method_index,slot,
                                 mutex,disconnectType);
        bVar1 = (bool)(bVar1 | bVar2);
        iVar3 = iVar3 + 1;
      }
LAB_0028cfb5:
      QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData>::~QExplicitlySharedDataPointer
                (&local_50);
      QBasicMutex::unlock((QBasicMutex *)local_48._0_8_);
      local_48._8_8_ = local_48._8_8_ & 0xffffffffffffff00;
      if (bVar1 != false) {
        QObjectPrivate::ConnectionData::cleanOrphanedConnections(connections.ptr,sender,NeedToLock);
        p_Var7 = signal((int)smeta,(__sighandler_t)(ulong)(uint)signal_index);
        local_70.context.version = (int)p_Var7;
        local_70.context.line = (int)((ulong)p_Var7 >> 0x20);
        local_70.context.file._0_4_ = (undefined4)extraout_RDX;
        local_70.context.file._4_4_ = (undefined4)((ulong)extraout_RDX >> 0x20);
        if (p_Var7 != (__sighandler_t)0x0) {
          (*sender->_vptr_QObject[0xb])(sender,&local_70);
        }
        bVar1 = true;
        goto LAB_0028d01d;
      }
    }
    else {
      if (((connections.ptr)->signalVector).super_QBasicAtomicPointer<QObjectPrivate::SignalVector>.
          _q_value._M_b._M_p == (__pointer_type)0x0) {
        iVar3 = -1;
      }
      else {
        iVar3 = (int)(((connections.ptr)->signalVector).
                      super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value._M_b._M_p)->
                     allocated;
      }
      if (signal_index < iVar3) {
        bVar1 = disconnectHelper(connections.ptr,signal_index,receiver,method_index,slot,mutex,
                                 disconnectType);
        goto LAB_0028cfb5;
      }
      QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData>::~QExplicitlySharedDataPointer
                (&local_50);
      QBasicMutex::unlock((QBasicMutex *)local_48._0_8_);
      local_48._8_8_ = local_48._8_8_ & 0xffffffffffffff00;
    }
    bVar1 = false;
  }
LAB_0028d01d:
  QMutexLocker<QBasicMutex>::~QMutexLocker((QMutexLocker<QBasicMutex> *)local_48);
LAB_0028d02a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QMetaObjectPrivate::disconnect(const QObject *sender,
                                    int signal_index, const QMetaObject *smeta,
                                    const QObject *receiver, int method_index, void **slot,
                                    DisconnectType disconnectType)
{
    if (!sender)
        return false;

    QObject *s = const_cast<QObject *>(sender);

    QBasicMutex *senderMutex = signalSlotLock(sender);
    QMutexLocker locker(senderMutex);

    QObjectPrivate::ConnectionData *scd = QObjectPrivate::get(s)->connections.loadRelaxed();
    if (!scd)
        return false;

    bool success = false;
    {
        // prevent incoming connections changing the connections->receivers while unlocked
        QObjectPrivate::ConnectionDataPointer connections(scd);

        if (signal_index < 0) {
            // wildcard disconnect - warn if this disconnects destroyed()
            if (!receiver && method_index < 0 && sender->d_func()->isSignalConnected(0)) {
                qWarning("QObject::disconnect: wildcard call disconnects from destroyed signal of"
                         " %s::%s", sender->metaObject()->className(),
                                    sender->objectName().isEmpty()
                                        ? "unnamed"
                                        : sender->objectName().toLocal8Bit().data());
            }
            // remove from all connection lists
            for (int sig_index = -1; sig_index < scd->signalVectorCount(); ++sig_index) {
                if (disconnectHelper(connections.data(), sig_index, receiver, method_index, slot, senderMutex, disconnectType))
                    success = true;
            }
        } else if (signal_index < scd->signalVectorCount()) {
            if (disconnectHelper(connections.data(), signal_index, receiver, method_index, slot, senderMutex, disconnectType))
                success = true;
        }
    }

    locker.unlock();
    if (success) {
        scd->cleanOrphanedConnections(s);

        QMetaMethod smethod = QMetaObjectPrivate::signal(smeta, signal_index);
        if (smethod.isValid())
            s->disconnectNotify(smethod);
    }

    return success;
}